

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O3

void __thiscall Graph::addNode(Graph *this)

{
  _Rb_tree_header *p_Var1;
  pointer *pppNVar2;
  iterator __position;
  int iVar3;
  Node *node;
  Node *local_10;
  
  local_10 = (Node *)operator_new(0x48);
  iVar3 = this->inserted_nodes;
  p_Var1 = &(local_10->edges)._M_t._M_impl.super__Rb_tree_header;
  (local_10->edges)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (local_10->edges)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (local_10->edges)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (local_10->edges)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  local_10->error = 0.0;
  (local_10->edges)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (local_10->coords).x = 0;
  (local_10->coords).y = 0;
  local_10->index = iVar3;
  __position._M_current =
       (this->adj_list).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->adj_list).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
              ((vector<Node*,std::allocator<Node*>> *)this,__position,&local_10);
    iVar3 = this->inserted_nodes;
  }
  else {
    *__position._M_current = local_10;
    pppNVar2 = &(this->adj_list).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppNVar2 = *pppNVar2 + 1;
  }
  this->inserted_nodes = iVar3 + 1;
  return;
}

Assistant:

void Graph::addNode() {
    // TODO: Modify function (Can fall on duplicate indexes)
    // Possible solution: add a variable that stores the number of total insertions
    Node* node = new Node(inserted_nodes);
    adj_list.push_back(node);
    inserted_nodes++;
}